

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

void roaring64_bitmap_to_uint64_array(roaring64_bitmap_t *r,uint64_t *out)

{
  roaring64_iterator_t it;
  
  roaring64_iterator_init_at(r,&it,true);
  roaring64_iterator_read(&it,out,0xffffffffffffffff);
  return;
}

Assistant:

void roaring64_bitmap_to_uint64_array(const roaring64_bitmap_t *r,
                                      uint64_t *out) {
    roaring64_iterator_t it;  // gets initialized in the next line
    roaring64_iterator_init_at(r, &it, /*first=*/true);
    roaring64_iterator_read(&it, out, UINT64_MAX);
}